

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O1

archive_string * archive_string_ensure(archive_string *as,size_t s)

{
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  int *piVar4;
  
  pcVar3 = as->s;
  if ((pcVar3 != (char *)0x0) && (s <= as->buffer_length)) {
    return as;
  }
  uVar1 = as->buffer_length;
  uVar2 = 0x20;
  if (0x1f < uVar1) {
    if (uVar1 < 0x2000) {
      uVar2 = uVar1 * 2;
    }
    else {
      uVar2 = (uVar1 >> 2) + uVar1;
      if (CARRY8(uVar1 >> 2,uVar1)) {
        as->length = 0;
        as->buffer_length = 0;
        goto LAB_0025dd9a;
      }
    }
  }
  if (s < uVar2) {
    s = uVar2;
  }
  pcVar3 = (char *)realloc(pcVar3,s);
  if (pcVar3 != (char *)0x0) {
    as->s = pcVar3;
    as->buffer_length = s;
    return as;
  }
  as->length = 0;
  as->buffer_length = 0;
  pcVar3 = as->s;
LAB_0025dd9a:
  free(pcVar3);
  as->s = (char *)0x0;
  piVar4 = __errno_location();
  *piVar4 = 0xc;
  return (archive_string *)0x0;
}

Assistant:

struct archive_string *
archive_string_ensure(struct archive_string *as, size_t s)
{
	char *p;
	size_t new_length;

	/* If buffer is already big enough, don't reallocate. */
	if (as->s && (s <= as->buffer_length))
		return (as);

	/*
	 * Growing the buffer at least exponentially ensures that
	 * append operations are always linear in the number of
	 * characters appended.  Using a smaller growth rate for
	 * larger buffers reduces memory waste somewhat at the cost of
	 * a larger constant factor.
	 */
	if (as->buffer_length < 32)
		/* Start with a minimum 32-character buffer. */
		new_length = 32;
	else if (as->buffer_length < 8192)
		/* Buffers under 8k are doubled for speed. */
		new_length = as->buffer_length + as->buffer_length;
	else {
		/* Buffers 8k and over grow by at least 25% each time. */
		new_length = as->buffer_length + as->buffer_length / 4;
		/* Be safe: If size wraps, fail. */
		if (new_length < as->buffer_length) {
			/* On failure, wipe the string and return NULL. */
			archive_string_free(as);
			errno = ENOMEM;/* Make sure errno has ENOMEM. */
			return (NULL);
		}
	}
	/*
	 * The computation above is a lower limit to how much we'll
	 * grow the buffer.  In any case, we have to grow it enough to
	 * hold the request.
	 */
	if (new_length < s)
		new_length = s;
	/* Now we can reallocate the buffer. */
	p = realloc(as->s, new_length);
	if (p == NULL) {
		/* On failure, wipe the string and return NULL. */
		archive_string_free(as);
		errno = ENOMEM;/* Make sure errno has ENOMEM. */
		return (NULL);
	}

	as->s = p;
	as->buffer_length = new_length;
	return (as);
}